

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-dt-erector.cpp
# Opt level: O1

Up __thiscall
yactfr::internal::PseudoDtErector::_aliasedPseudoDt
          (PseudoDtErector *this,string *name,TextLocation *textLoc)

{
  string msg;
  iterator iVar1;
  ostream *poVar2;
  undefined1 (*in_RCX) [24];
  ostringstream ss;
  undefined8 in_stack_fffffffffffffe50;
  TextLocation in_stack_fffffffffffffe58;
  ostringstream local_190 [376];
  
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)name,(key_type *)textLoc);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    (**(code **)(**(long **)((long)iVar1.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>_>,_true>
                                   ._M_cur + 0x28) + 0x48))(this);
    return (__uniq_ptr_data<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>,_true,_true>
            )(__uniq_ptr_data<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>,_true,_true>
              )this;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Cannot find data type alias `",0x1d);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(char *)textLoc->_offset,textLoc->_lineNumber);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"`.",2);
  std::__cxx11::stringbuf::str();
  msg.field_2._8_8_ = in_stack_fffffffffffffe50;
  msg._0_24_ = *in_RCX;
  throwTextParseError(msg,in_stack_fffffffffffffe58);
}

Assistant:

PseudoDt::Up PseudoDtErector::_aliasedPseudoDt(const std::string& name,
                                               const TextLocation& textLoc)
{
    const auto it = _aliases.find(name);

    if (it == _aliases.end()) {
        std::ostringstream ss;

        ss << "Cannot find data type alias `" << name << "`.";
        throwTextParseError(ss.str(), textLoc);
    }

    return it->second->clone();
}